

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O2

SyntaxPrinter * __thiscall
slang::syntax::SyntaxPrinter::append(SyntaxPrinter *this,string_view text)

{
  char cVar1;
  size_type sVar2;
  ulong __pos;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  string_view local_30;
  
  pcVar4 = text._M_str;
  uVar5 = text._M_len;
  local_30 = text;
  if (this->squashNewlines != true) goto LAB_0059730e;
  if (uVar5 == 0) {
LAB_00597299:
    bVar7 = false;
    bVar6 = false;
  }
  else {
    cVar1 = *pcVar4;
    bVar6 = cVar1 == '\r';
    if ((!bVar6) && (cVar1 != '\n')) goto LAB_00597299;
    uVar3 = (ulong)(cVar1 == '\r');
    if (uVar3 < uVar5) {
      bVar7 = pcVar4[uVar3] == '\n';
      __pos = (ulong)(cVar1 == '\r') + 1;
      if (!bVar7) {
        __pos = uVar3;
      }
    }
    else {
      bVar7 = false;
      __pos = 1;
    }
    for (; __pos < uVar5; __pos = __pos + 1) {
      if ((pcVar4[__pos] == '\r') || (pcVar4[__pos] == '\n')) {
        __pos = __pos + 1;
      }
    }
    local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_30,__pos,0xffffffffffffffff);
  }
  sVar2 = (this->buffer)._M_string_length;
  if ((sVar2 == 0) || ((this->buffer)._M_dataplus._M_p[sVar2 - 1] != '\n')) {
    if (bVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\r');
    }
    if (bVar7) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->buffer,'\n');
    }
  }
LAB_0059730e:
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this,&local_30);
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::append(std::string_view text) {
    if (!squashNewlines) {
        buffer.append(text);
        return *this;
    }

    bool carriage = false;
    bool newline = false;

    if (!text.empty() && (text[0] == '\r' || text[0] == '\n')) {
        size_t i = 0;
        if (text[i] == '\r') {
            carriage = true;
            i++;
        }

        if (i < text.length() && text[i] == '\n') {
            newline = true;
            i++;
        }

        for (; i < text.length(); i++) {
            if (text[i] == '\r' || text[i] == '\n')
                i++;
        }

        text = text.substr(i);
    }

    if (buffer.empty() || buffer.back() != '\n') {
        if (carriage)
            buffer.push_back('\r');
        if (newline)
            buffer.push_back('\n');
    }

    buffer.append(text);
    return *this;
}